

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O3

ArenaAllocator * __thiscall
duckdb::WindowSegmentTreeGlobalState::CreateTreeAllocator(WindowSegmentTreeGlobalState *this)

{
  mutex *__mutex;
  _Head_base<0UL,_duckdb::ArenaAllocator_*,_false> _Var1;
  int iVar2;
  Allocator *allocator;
  ArenaAllocator *this_00;
  reference this_01;
  type pAVar3;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ArenaAllocator_*,_false> local_28;
  
  __mutex = &(this->super_WindowAggregatorGlobalState).lock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    allocator = Allocator::DefaultAllocator();
    this_00 = (ArenaAllocator *)operator_new(0x48);
    ArenaAllocator::ArenaAllocator(this_00,allocator,0x800);
    local_28._M_head_impl = this_00;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
                *)&this->tree_allocators,
               (unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
                *)&local_28);
    _Var1._M_head_impl = local_28._M_head_impl;
    if (local_28._M_head_impl != (ArenaAllocator *)0x0) {
      ArenaAllocator::~ArenaAllocator(local_28._M_head_impl);
      operator_delete(_Var1._M_head_impl);
    }
    this_01 = vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_true>
              ::back(&this->tree_allocators);
    pAVar3 = unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
             operator*(this_01);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return pAVar3;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

ArenaAllocator &CreateTreeAllocator() {
		lock_guard<mutex> tree_lock(lock);
		tree_allocators.emplace_back(make_uniq<ArenaAllocator>(Allocator::DefaultAllocator()));
		return *tree_allocators.back();
	}